

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void essence_of_plasma_pulse(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  ROOM_AFFECT_DATA *in_stack_00000008;
  ROOM_INDEX_DATA *in_stack_00000010;
  int dam;
  bool fighting;
  bool found;
  bool valid_target;
  CHAR_DATA *victim;
  undefined1 in_stack_00001332;
  undefined1 in_stack_00001333;
  int in_stack_00001334;
  int in_stack_00001338;
  int in_stack_0000133c;
  CHAR_DATA *in_stack_00001340;
  CHAR_DATA *in_stack_00001348;
  int in_stack_00001368;
  int in_stack_00001370;
  char *in_stack_00001378;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 uVar3;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  CHAR_DATA *pCVar8;
  
  bVar7 = 0;
  bVar6 = 0;
  bVar5 = 0;
  if (*(long *)(in_RDI + 0x18) != 0) {
    for (pCVar8 = *(CHAR_DATA **)(in_RDI + 0x18); pCVar8 != (CHAR_DATA *)0x0;
        pCVar8 = pCVar8->next_in_room) {
      bVar1 = is_safe_new(pCVar8,(CHAR_DATA *)
                                 CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(
                                                  in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0)))),
                          (bool)in_stack_ffffffffffffffdf);
      if (!bVar1) {
        bVar7 = 1;
      }
    }
    if ((bVar7 & 1) != 0) {
      pCVar8 = (CHAR_DATA *)0x0;
LAB_006eacf2:
      if (((bVar6 ^ 0xff) & 1) != 0) {
        for (pCVar8 = *(CHAR_DATA **)(in_RDI + 0x18); pCVar8 != (CHAR_DATA *)0x0;
            pCVar8 = pCVar8->next_in_room) {
          bVar1 = is_safe_new(pCVar8,(CHAR_DATA *)
                                     CONCAT17(bVar7,CONCAT16(bVar6,CONCAT15(bVar5,CONCAT14(
                                                  in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0)))),
                              (bool)in_stack_ffffffffffffffdf);
          if ((!bVar1) && (iVar2 = number_percent(), 0x4f < iVar2)) {
            bVar6 = 1;
            break;
          }
        }
        goto LAB_006eacf2;
      }
      if (pCVar8->fighting != (CHAR_DATA *)0x0) {
        bVar5 = 1;
      }
      if (*(short *)(in_RSI + 0x1c) == 0) {
        *(undefined2 *)(in_RSI + 0x1c) = 1;
      }
      dice(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      act(in_stack_ffffffffffffffd0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
          (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
          (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      uVar3 = 0;
      uVar4 = 0;
      damage_new(in_stack_00001348,in_stack_00001340,in_stack_0000133c,in_stack_00001338,
                 in_stack_00001334,(bool)in_stack_00001333,(bool)in_stack_00001332,in_stack_00001368
                 ,in_stack_00001370,in_stack_00001378);
      if (((bVar5 & 1) == 0) &&
         (bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffbc,uVar3)), !bVar1)) {
        stop_fighting((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffc4,uVar4),
                      SUB41((uint)in_stack_ffffffffffffffbc >> 0x18,0));
      }
      *(short *)(in_RSI + 0x1c) = *(short *)(in_RSI + 0x1c) + 1;
      if (0x18 < *(short *)(in_RSI + 0x1c)) {
        affect_remove_room(in_stack_00000010,in_stack_00000008);
      }
    }
  }
  return;
}

Assistant:

void essence_of_plasma_pulse(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim;
	bool valid_target = false, found = false, fighting = false;
	int dam;

	if (!room->people)
		return;

	for (victim = room->people; victim; victim = victim->next_in_room)
	{
		if (!is_safe_new(af->owner, victim, false))
			valid_target = true;
	}

	if (!valid_target)
		return;

	while (!found)
	{
		for (victim = room->people; victim; victim = victim->next_in_room)
		{
			if (is_safe_new(af->owner, victim, false))
				continue;

			if (number_percent() < 80)
				continue;

			found = true;
			break;
		}
	}

	if (victim->fighting)
		fighting = true;

	if (af->modifier == 0)
		af->modifier = 1;

	dam = dice(af->level, 10) / af->modifier;

	act("The ball of plasma hurtles about wildly, discharging pure energy into you!", victim, 0, 0, TO_CHAR);
	act("The ball of plasma hurtles about wildly, discharging pure energy into $n!", victim, 0, 0, TO_ROOM);

	damage_new(af->owner, victim, dam, gsn_essence_of_plasma, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the essence of plasma*");

	if (!fighting && !is_npc(victim))
		stop_fighting(victim, true);

	af->modifier++;

	if (af->modifier >= 25)
		affect_remove_room(room, af);
}